

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O3

void Curl_ssl_scache_return(Curl_cfilter *cf,Curl_easy *data,char *ssl_peer_key,Curl_ssl_session *s)

{
  if (s == (Curl_ssl_session *)0x0) {
    return;
  }
  if (s->ietf_tls_id < 0x304) {
    Curl_ssl_scache_put(cf,data,ssl_peer_key,s);
    return;
  }
  Curl_ssl_session_destroy(s);
  return;
}

Assistant:

void Curl_ssl_scache_return(struct Curl_cfilter *cf,
                           struct Curl_easy *data,
                           const char *ssl_peer_key,
                           struct Curl_ssl_session *s)
{
  /* See RFC 8446 C.4:
   * "Clients SHOULD NOT reuse a ticket for multiple connections." */
  if(s && s->ietf_tls_id < 0x304)
    (void)Curl_ssl_scache_put(cf, data, ssl_peer_key, s);
  else
    Curl_ssl_session_destroy(s);
}